

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int initStaticArchivers(void)

{
  int iVar1;
  int local_c;
  
  iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_ZIP);
  if (iVar1 == 0) {
    local_c = 0;
  }
  else {
    SZIP_global_init();
    iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_7Z);
    if (iVar1 == 0) {
      local_c = 0;
    }
    else {
      iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_GRP);
      if (iVar1 == 0) {
        local_c = 0;
      }
      else {
        iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_QPAK);
        if (iVar1 == 0) {
          local_c = 0;
        }
        else {
          iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_HOG);
          if (iVar1 == 0) {
            local_c = 0;
          }
          else {
            iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_MVL);
            if (iVar1 == 0) {
              local_c = 0;
            }
            else {
              iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_WAD);
              if (iVar1 == 0) {
                local_c = 0;
              }
              else {
                iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_CSM);
                if (iVar1 == 0) {
                  local_c = 0;
                }
                else {
                  iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_SLB);
                  if (iVar1 == 0) {
                    local_c = 0;
                  }
                  else {
                    iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_ISO9660);
                    if (iVar1 == 0) {
                      local_c = 0;
                    }
                    else {
                      iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_VDF);
                      if (iVar1 == 0) {
                        local_c = 0;
                      }
                      else {
                        iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_GOB);
                        if (iVar1 == 0) {
                          local_c = 0;
                        }
                        else {
                          iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_LFD);
                          if (iVar1 == 0) {
                            local_c = 0;
                          }
                          else {
                            iVar1 = doRegisterArchiver(&__PHYSFS_Archiver_LAB);
                            if (iVar1 == 0) {
                              local_c = 0;
                            }
                            else {
                              local_c = 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

static int initStaticArchivers(void)
{
    #define REGISTER_STATIC_ARCHIVER(arc) { \
        if (!doRegisterArchiver(&__PHYSFS_Archiver_##arc)) { \
            return 0; \
        } \
    }

    #if PHYSFS_SUPPORTS_ZIP
        REGISTER_STATIC_ARCHIVER(ZIP);
    #endif
    #if PHYSFS_SUPPORTS_7Z
        SZIP_global_init();
        REGISTER_STATIC_ARCHIVER(7Z);
    #endif
    #if PHYSFS_SUPPORTS_GRP
        REGISTER_STATIC_ARCHIVER(GRP);
    #endif
    #if PHYSFS_SUPPORTS_QPAK
        REGISTER_STATIC_ARCHIVER(QPAK);
    #endif
    #if PHYSFS_SUPPORTS_HOG
        REGISTER_STATIC_ARCHIVER(HOG);
    #endif
    #if PHYSFS_SUPPORTS_MVL
        REGISTER_STATIC_ARCHIVER(MVL);
    #endif
    #if PHYSFS_SUPPORTS_WAD
        REGISTER_STATIC_ARCHIVER(WAD);
    #endif
    #if PHYSFS_SUPPORTS_CSM
        REGISTER_STATIC_ARCHIVER(CSM);
    #endif
    #if PHYSFS_SUPPORTS_SLB
        REGISTER_STATIC_ARCHIVER(SLB);
    #endif
    #if PHYSFS_SUPPORTS_ISO9660
        REGISTER_STATIC_ARCHIVER(ISO9660);
    #endif
    #if PHYSFS_SUPPORTS_VDF
        REGISTER_STATIC_ARCHIVER(VDF)
    #endif
    #if PHYSFS_SUPPORTS_LECARCHIVES
        REGISTER_STATIC_ARCHIVER(GOB)
        REGISTER_STATIC_ARCHIVER(LFD)
        REGISTER_STATIC_ARCHIVER(LAB)
    #endif

    #undef REGISTER_STATIC_ARCHIVER

    return 1;
}